

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void aesenclast(PDISASM pMyDisasm)

{
  UIntPtr UVar1;
  ulong uVar2;
  uint uVar3;
  
  if ((pMyDisasm->Reserved_).PrefRepe == 1) {
    if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
      if ((pMyDisasm->Prefix).LockPrefix == '\x04') {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      UVar1 = (pMyDisasm->Reserved_).EIP_;
      uVar2 = (pMyDisasm->Reserved_).EndOfBlock;
      if (uVar2 < UVar1 + 2 && uVar2 != 0) {
        (pMyDisasm->Reserved_).OutOfBlock = 1;
        (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
        return;
      }
      uVar3 = (uint)(*(byte *)(UVar1 + 1) >> 6);
      (pMyDisasm->Reserved_).MOD_ = uVar3;
      if (uVar3 != 3) {
        (pMyDisasm->Instruction).Category = 0x220000;
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"aesdec128kl",0xc);
        (pMyDisasm->Reserved_).MemDecoration = 0x69;
        (pMyDisasm->Operand2).OpSize = 0x180;
        (pMyDisasm->Reserved_).Register_ = 4;
        decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
        decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Reserved_).EIP_ =
             (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
        return;
      }
    }
  }
  else if ((pMyDisasm->Reserved_).OperandSize == 0x10) {
    if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      (pMyDisasm->Reserved_).MemDecoration = 0x6f;
      (pMyDisasm->Instruction).Category = 0xf0000;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"aesenclast",0xb);
      (pMyDisasm->Reserved_).Register_ = 4;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      (pMyDisasm->Operand1).AccessMode = 3;
      return;
    }
    (pMyDisasm->Instruction).Category = 0xf0000;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vaesenclast",0xc);
    if ((pMyDisasm->Reserved_).VEX.vvvv != '\x0f') {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
    (pMyDisasm->Reserved_).Register_ = 4;
    (pMyDisasm->Reserved_).MemDecoration = 0xd3;
    GyEy(pMyDisasm);
    return;
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  return;
}

Assistant:

void __bea_callspec__ aesenclast(PDISASM pMyDisasm)
{
  /* ========== 0xf3 */
  if (GV.PrefRepe == 1) {
    if (GV.VEX.state == InUsePrefix) { failDecode(pMyDisasm);return; }
    if (pMyDisasm->Prefix.LockPrefix == InvalidPrefix) GV.ERROR_OPCODE=UD_;
    if (!Security(2, pMyDisasm)) return;
    GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
    if (GV.MOD_ != 0x3) {
      pMyDisasm->Instruction.Category = KL_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "aesdec128kl");
      #endif
      GV.MemDecoration = Arg2multibytes;
      pMyDisasm->Operand2.OpSize = 384;
      GV.Register_ = SSE_REG;
      GxEx(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
    /* ========== 0x66 */
  else if (GV.OperandSize == 16) {
        if (GV.VEX.state == InUsePrefix) {
            pMyDisasm->Instruction.Category = AES_INSTRUCTION;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vaesenclast");
            #endif
            if (GV.VEX.vvvv != 15) {
              GV.ERROR_OPCODE = UD_;
            }
            GV.Register_ = SSE_REG;
            GV.MemDecoration = Arg3_m128i_xmm;
            GyEy(pMyDisasm);
        }
        else {
            GV.OperandSize = GV.OriginalOperandSize;
            pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
            GV.MemDecoration = Arg2_m128i_xmm;
            pMyDisasm->Instruction.Category = AES_INSTRUCTION;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy (pMyDisasm->Instruction.Mnemonic, "aesenclast");
            #endif
            GV.Register_ = SSE_REG;
            GxEx(pMyDisasm);
            pMyDisasm->Operand1.AccessMode = READ + WRITE;
        }
    }
    else {
        failDecode(pMyDisasm);
    }
}